

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,char *ptr,int d)

{
  char *pcVar1;
  int *piVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  char *in_RSI;
  EpsCopyInputStream *in_RDI;
  pair<const_char_*,_bool> pVar4;
  char *p;
  int overrun;
  bool local_2a9;
  int local_2a8;
  bool local_2a3 [3];
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  EpsCopyInputStream *in_stack_fffffffffffffd68;
  bool local_261;
  void *local_260;
  char *local_258;
  bool local_c9;
  void *local_c8 [9];
  int local_7c;
  char *local_20 [2];
  pair<const_char_*,_bool> local_10;
  
  local_7c = (int)in_RSI - (int)in_RDI->buffer_end_;
  local_20[0] = in_RSI;
  if (in_RDI->limit_ < local_7c) {
    local_c8[0] = (void *)0x0;
    local_c9 = true;
    std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>(&local_10,local_c8,&local_c9);
    uVar3 = extraout_RDX;
  }
  else {
    do {
      local_258 = Next(in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60
                      );
      if (local_258 == (char *)0x0) {
        if (local_7c == 0) {
          in_RDI->limit_end_ = in_RDI->buffer_end_;
          SetEndOfStream(in_RDI);
          local_2a3[0] = true;
          std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>
                    (&local_10,local_20,local_2a3);
          uVar3 = extraout_RDX_01;
        }
        else {
          local_260 = (void *)0x0;
          local_261 = true;
          std::pair<const_char_*,_bool>::pair<std::nullptr_t,_bool,_true>
                    (&local_10,&local_260,&local_261);
          uVar3 = extraout_RDX_00;
        }
        goto LAB_003e39f0;
      }
      in_RDI->limit_ = in_RDI->limit_ - ((int)in_RDI->buffer_end_ - (int)local_258);
      local_20[0] = local_258 + local_7c;
      local_7c = (int)local_20[0] - (int)in_RDI->buffer_end_;
    } while (-1 < local_7c);
    pcVar1 = in_RDI->buffer_end_;
    local_2a8 = 0;
    piVar2 = std::min<int>(&local_2a8,&in_RDI->limit_);
    in_RDI->limit_end_ = pcVar1 + *piVar2;
    local_2a9 = false;
    std::pair<const_char_*,_bool>::pair<const_char_*&,_bool,_true>(&local_10,local_20,&local_2a9);
    uVar3 = extraout_RDX_02;
  }
LAB_003e39f0:
  pVar4._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  pVar4.second = local_10.second;
  pVar4.first = local_10.first;
  return pVar4;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(const char* ptr,
                                                              int d) {
  GOOGLE_DCHECK(ptr >= limit_end_);
  int overrun = ptr - buffer_end_;
  GOOGLE_DCHECK(overrun <= kSlopBytes);  // Guaranteed by parse loop.
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    auto p = Next(overrun, d);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinquish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {ptr, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    ptr = p + overrun;
    overrun = ptr - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {ptr, false};
}